

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O3

char * luaJIT_profile_dumpstack(lua_State *L,char *fmt,int depth,size_t *len)

{
  char *pcVar1;
  
  profile_state.sb.w = profile_state.sb.b;
  profile_state.sb.L.ptr64 = (uint64_t)L;
  lj_debug_dumpstack(L,&profile_state.sb,fmt,depth);
  pcVar1 = profile_state.sb.b;
  *len = (ulong)(uint)((int)profile_state.sb.w - (int)profile_state.sb.b);
  return pcVar1;
}

Assistant:

LUA_API const char *luaJIT_profile_dumpstack(lua_State *L, const char *fmt,
					     int depth, size_t *len)
{
  ProfileState *ps = &profile_state;
  SBuf *sb = &ps->sb;
  setsbufL(sb, L);
  lj_buf_reset(sb);
  lj_debug_dumpstack(L, sb, fmt, depth);
  *len = (size_t)sbuflen(sb);
  return sb->b;
}